

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

void __thiscall dgMeshEffect::EndPolygon(dgMeshEffect *this,HaF64 tol)

{
  dgBigVector *pdVar1;
  double dVar2;
  double dVar3;
  dgBigVector *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  HaI32 HVar8;
  HaI32 *indexListOut;
  int *piVar9;
  dgEdge *pdVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  HaI32 index [3];
  dgStack<int> attrIndexMap;
  dgStack<int> indexMap;
  HaI64 userdata [3];
  int local_7c;
  int local_78;
  int local_74;
  HaF64 local_70;
  dgStack<int> local_68;
  dgStack<int> local_58;
  long local_48;
  long local_40;
  long local_38;
  
  iVar15 = *(int *)&(this->super_dgRefCounter).field_0xc;
  local_70 = tol;
  indexListOut = (HaI32 *)malloc((long)(iVar15 * 4));
  iVar13 = this->m_atribCount;
  local_58.super_dgStackBase.m_ptr = indexListOut;
  local_58.m_size = iVar15;
  local_68.super_dgStackBase.m_ptr = malloc((long)(iVar13 * 4));
  local_68.m_size = iVar13;
  if (-1 < iVar15) {
    HVar8 = dgVertexListToIndexList((HaF64 *)this->m_points,0x20,4,iVar15,indexListOut,local_70);
    *(HaI32 *)&(this->super_dgRefCounter).field_0xc = HVar8;
    if (-1 < local_68.m_size) {
      HVar8 = dgVertexListToIndexList
                        ((HaF64 *)this->m_attib,0x60,0xc,this->m_atribCount,
                         (HaI32 *)local_68.super_dgStackBase.m_ptr,local_70);
      this->m_atribCount = HVar8;
      if (2 < iVar15) {
        uVar14 = iVar15 / 3;
        iVar15 = 0;
        do {
          local_70 = (HaF64)(ulong)uVar14;
          piVar9 = dgStack<int>::operator[](&local_58,iVar15);
          local_7c = *piVar9;
          piVar9 = dgStack<int>::operator[](&local_58,iVar15 + 1);
          local_78 = *piVar9;
          piVar9 = dgStack<int>::operator[](&local_58,iVar15 + 2);
          local_74 = *piVar9;
          pdVar4 = this->m_points;
          lVar11 = (long)local_78;
          lVar12 = (long)local_7c;
          dVar2 = pdVar4[lVar12].super_dgTemplateVector<double>.m_x;
          dVar3 = pdVar4[lVar12].super_dgTemplateVector<double>.m_y;
          dVar5 = pdVar4[lVar11].super_dgTemplateVector<double>.m_x - dVar2;
          dVar6 = pdVar4[lVar11].super_dgTemplateVector<double>.m_y - dVar3;
          dVar24 = pdVar4[lVar12].super_dgTemplateVector<double>.m_z;
          dVar7 = pdVar4[lVar11].super_dgTemplateVector<double>.m_z - dVar24;
          if ((((0x7fefffffffffffff < (long)ABS(dVar5)) || (0x7fefffffffffffff < (long)ABS(dVar6)))
              || (0x7fefffffffffffff < (long)ABS(dVar7))) ||
             (0x7fefffffffffffff < (ulong)ABS(pdVar4[lVar11].super_dgTemplateVector<double>.m_w))) {
LAB_00889f59:
            __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                          ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
          }
          dVar2 = pdVar4[local_74].super_dgTemplateVector<double>.m_x - dVar2;
          dVar3 = pdVar4[local_74].super_dgTemplateVector<double>.m_y - dVar3;
          dVar24 = pdVar4[local_74].super_dgTemplateVector<double>.m_z - dVar24;
          if (((0x7fefffffffffffff < (long)ABS(dVar2)) || (0x7fefffffffffffff < (long)ABS(dVar3)))
             || ((0x7fefffffffffffff < (long)ABS(dVar24) ||
                 (0x7fefffffffffffff <
                  (ulong)ABS(pdVar4[local_74].super_dgTemplateVector<double>.m_w)))))
          goto LAB_00889f59;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar6;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar3 * dVar7;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = dVar24;
          auVar18 = vfmsub231sd_fma(auVar23,auVar18,auVar25);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = dVar7;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = dVar2;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = dVar24 * dVar5;
          auVar16 = vfmsub231sd_fma(auVar26,auVar22,auVar20);
          dVar24 = auVar16._0_8_;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar5;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = dVar2 * dVar6;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar3;
          auVar16 = vfmsub231sd_fma(auVar19,auVar16,auVar21);
          if (((0x7fefffffffffffff < (auVar18._0_8_ & 0x7fffffffffffffff)) ||
              (0x7fefffffffffffff < (ulong)ABS(dVar24))) ||
             (0x7fefffffffffffff < (auVar16._0_8_ & 0x7fffffffffffffff))) goto LAB_00889f59;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar24 * dVar24;
          auVar18 = vfmadd213sd_fma(auVar18,auVar18,auVar17);
          auVar18 = vfmadd213sd_fma(auVar16,auVar16,auVar18);
          iVar13 = SUB84(local_70,0);
          if (9.999999960041972e-13 < auVar18._0_8_) {
            piVar9 = dgStack<int>::operator[](&local_68,iVar15);
            local_48 = (long)*piVar9;
            piVar9 = dgStack<int>::operator[](&local_68,iVar15 + 1);
            local_40 = (long)*piVar9;
            piVar9 = dgStack<int>::operator[](&local_68,iVar15 + 2);
            local_38 = (long)*piVar9;
            pdVar10 = dgPolyhedra::AddFace(&this->super_dgPolyhedra,3,&local_7c,&local_48);
            if (pdVar10 == (dgEdge *)0x0) {
              iVar13 = *(int *)&(this->super_dgRefCounter).field_0xc;
              if (this->m_maxPointCount < iVar13 + 3) {
                __assert_fail("(m_pointCount + 3) <= m_maxPointCount",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                              ,0x471,"void dgMeshEffect::EndPolygon(hacd::HaF64)");
              }
              pdVar4 = this->m_points + local_7c;
              dVar2 = (pdVar4->super_dgTemplateVector<double>).m_y;
              dVar3 = (pdVar4->super_dgTemplateVector<double>).m_z;
              dVar24 = (pdVar4->super_dgTemplateVector<double>).m_w;
              pdVar1 = this->m_points + iVar13;
              (pdVar1->super_dgTemplateVector<double>).m_x =
                   (pdVar4->super_dgTemplateVector<double>).m_x;
              (pdVar1->super_dgTemplateVector<double>).m_y = dVar2;
              (pdVar1->super_dgTemplateVector<double>).m_z = dVar3;
              (pdVar1->super_dgTemplateVector<double>).m_w = dVar24;
              pdVar4 = this->m_points + local_78;
              dVar2 = (pdVar4->super_dgTemplateVector<double>).m_y;
              dVar3 = (pdVar4->super_dgTemplateVector<double>).m_z;
              dVar24 = (pdVar4->super_dgTemplateVector<double>).m_w;
              pdVar1 = this->m_points + (long)*(int *)&(this->super_dgRefCounter).field_0xc + 1;
              (pdVar1->super_dgTemplateVector<double>).m_x =
                   (pdVar4->super_dgTemplateVector<double>).m_x;
              (pdVar1->super_dgTemplateVector<double>).m_y = dVar2;
              (pdVar1->super_dgTemplateVector<double>).m_z = dVar3;
              (pdVar1->super_dgTemplateVector<double>).m_w = dVar24;
              pdVar4 = this->m_points + local_74;
              dVar2 = (pdVar4->super_dgTemplateVector<double>).m_y;
              dVar3 = (pdVar4->super_dgTemplateVector<double>).m_z;
              dVar24 = (pdVar4->super_dgTemplateVector<double>).m_w;
              pdVar1 = this->m_points + (long)*(int *)&(this->super_dgRefCounter).field_0xc + 2;
              (pdVar1->super_dgTemplateVector<double>).m_x =
                   (pdVar4->super_dgTemplateVector<double>).m_x;
              (pdVar1->super_dgTemplateVector<double>).m_y = dVar2;
              (pdVar1->super_dgTemplateVector<double>).m_z = dVar3;
              (pdVar1->super_dgTemplateVector<double>).m_w = dVar24;
              local_7c = *(int *)&(this->super_dgRefCounter).field_0xc;
              local_78 = local_7c + 1;
              local_74 = local_7c + 2;
              *(int *)&(this->super_dgRefCounter).field_0xc = local_7c + 3;
              dgPolyhedra::AddFace(&this->super_dgPolyhedra,3,&local_7c,&local_48);
              iVar13 = SUB84(local_70,0);
            }
          }
          iVar15 = iVar15 + 3;
          uVar14 = iVar13 - 1;
        } while (uVar14 != 0);
      }
      dgPolyhedra::EndFace(&this->super_dgPolyhedra);
      RepairTJoints(this,true);
      free(local_68.super_dgStackBase.m_ptr);
      free(local_58.super_dgStackBase.m_ptr);
      return;
    }
  }
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,"T &dgStack<int>::operator[](hacd::HaI32) [T = int]");
}

Assistant:

void dgMeshEffect::EndPolygon (hacd::HaF64 tol)
{
	dgStack<hacd::HaI32>indexMap(m_pointCount);
	dgStack<hacd::HaI32>attrIndexMap(m_atribCount);

#ifdef _DEBUG
	for (hacd::HaI32 i = 0; i < m_pointCount; i += 3) {
		dgBigVector p0 (m_points[i + 0]);
		dgBigVector p1 (m_points[i + 1]);
		dgBigVector p2 (m_points[i + 2]);
		dgBigVector e1 (p1 - p0);
		dgBigVector e2 (p2 - p0);
		dgBigVector n (e1 * e2);
		hacd::HaF64 mag2 = n % n;
//		HACD_ASSERT (mag2 > DG_MESH_EFFECT_TRIANGLE_MIN_AREA);
		HACD_ASSERT (mag2 > hacd::HaF32 (0.0f));
	}
#endif

	hacd::HaI32 triangCount = m_pointCount / 3;
	m_pointCount = dgVertexListToIndexList (&m_points[0].m_x, sizeof (dgBigVector), sizeof (dgBigVector)/sizeof (hacd::HaF64), m_pointCount, &indexMap[0], tol);
	m_atribCount = dgVertexListToIndexList (&m_attib[0].m_vertex.m_x, sizeof (dgVertexAtribute), sizeof (dgVertexAtribute)/sizeof (hacd::HaF64), m_atribCount, &attrIndexMap[0], tol);

	for (hacd::HaI32 i = 0; i < triangCount; i ++) {
		hacd::HaI32 index[3];
		hacd::HaI64 userdata[3];

		index[0] = indexMap[i * 3 + 0];
		index[1] = indexMap[i * 3 + 1];
		index[2] = indexMap[i * 3 + 2];


		dgBigVector e1 (m_points[index[1]] - m_points[index[0]]);
		dgBigVector e2 (m_points[index[2]] - m_points[index[0]]);

		dgBigVector n (e1 * e2);
		hacd::HaF64 mag2 = n % n;
		if (mag2 > hacd::HaF64 (1.0e-12f)) {
			userdata[0] = attrIndexMap[i * 3 + 0];
			userdata[1] = attrIndexMap[i * 3 + 1];
			userdata[2] = attrIndexMap[i * 3 + 2];
			dgEdge* const edge = AddFace (3, index, userdata);
			if (!edge) {
				HACD_ASSERT ((m_pointCount + 3) <= m_maxPointCount);

				m_points[m_pointCount + 0] = m_points[index[0]];
				m_points[m_pointCount + 1] = m_points[index[1]];
				m_points[m_pointCount + 2] = m_points[index[2]];

				index[0] = m_pointCount + 0;
				index[1] = m_pointCount + 1;
				index[2] = m_pointCount + 2;

				m_pointCount += 3;

				#ifdef _DEBUG
					dgEdge* test = AddFace (3, index, userdata);
					HACD_ASSERT (test);
				#else 
					AddFace (3, index, userdata);
				#endif
			}
		}
	}
	EndFace();

	RepairTJoints (true);


#ifdef _DEBUG
	dgPolyhedra::Iterator iter (*this);	
	for (iter.Begin(); iter; iter ++){
		dgEdge* const face = &(*iter);
		if (face->m_incidentFace > 0) {
			dgBigVector p0 (m_points[face->m_incidentVertex]);
			dgBigVector p1 (m_points[face->m_next->m_incidentVertex]);
			dgBigVector p2 (m_points[face->m_next->m_next->m_incidentVertex]);
			dgBigVector e1 (p1 - p0);
			dgBigVector e2 (p2 - p0);
			dgBigVector n (e1 * e2);
//			HACD_ASSERT (mag2 > DG_MESH_EFFECT_TRIANGLE_MIN_AREA);
			hacd::HaF64 mag2 = n % n;
			HACD_ASSERT (mag2 > hacd::HaF32 (0.0f));
		}
	}
#endif
}